

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonmodelserialiser.cpp
# Opt level: O1

bool __thiscall JsonModelSerialiser::saveModel(JsonModelSerialiser *this,QString *destination)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  byte bVar4;
  QByteArrayView QVar5;
  QJsonDocument jDoc;
  QJsonDocument local_60 [8];
  QArrayData *local_58;
  char16_t *local_50;
  qsizetype local_48;
  QByteArray local_40;
  QByteArrayView local_28;
  
  if ((destination == (QString *)0x0) ||
     (((this->super_AbstractStringSerialiser).super_AbstractModelSerialiser.d_ptr.d)->m_constModel
      == (QAbstractItemModel *)0x0)) {
    bVar4 = 0;
  }
  else {
    (**(code **)(*(long *)&(this->super_AbstractStringSerialiser).super_AbstractModelSerialiser +
                0xd0))((QJsonObject *)&local_58);
    QJsonDocument::QJsonDocument(local_60,(QJsonObject *)&local_58);
    QJsonObject::~QJsonObject((QJsonObject *)&local_58);
    bVar4 = QJsonDocument::isNull();
    if (bVar4 == 0) {
      QJsonDocument::toJson((JsonFormat)&local_40);
      QByteArrayView::QByteArrayView<QByteArray,_true>(&local_28,&local_40);
      QVar5.m_data = (storage_type *)local_28.m_size;
      QVar5.m_size = (qsizetype)&local_58;
      QString::fromUtf8(QVar5);
      pQVar1 = &((destination->d).d)->super_QArrayData;
      (destination->d).d = (Data *)local_58;
      pcVar2 = (destination->d).ptr;
      (destination->d).ptr = local_50;
      qVar3 = (destination->d).size;
      (destination->d).size = local_48;
      local_58 = pQVar1;
      local_50 = pcVar2;
      local_48 = qVar3;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,8);
        }
      }
      if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,1,8);
        }
      }
    }
    bVar4 = bVar4 ^ 1;
    QJsonDocument::~QJsonDocument(local_60);
  }
  return (bool)bVar4;
}

Assistant:

bool JsonModelSerialiser::saveModel(QString *destination) const
{
    if (!destination)
        return false;
    Q_D(const JsonModelSerialiser);
    if (!d->m_constModel)
        return false;
    const QJsonDocument jDoc(toJsonObject());
    if (jDoc.isNull())
        return false;
    *destination = QString::fromUtf8(jDoc.toJson(d->m_format));
    return true;
}